

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::ReadBuffersResponse_Slice::ParseFromArray
          (ReadBuffersResponse_Slice *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  uint8_t cur_byte_2;
  uint8_t cur_byte;
  ulong uVar9;
  uint8_t cur_byte_1;
  ulong *puVar10;
  Field local_40;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar7 = (ulong *)(size + (long)raw);
  do {
    if (puVar7 <= raw) goto switchD_0024f847_caseD_3;
    bVar1 = (byte)*raw;
    uVar6 = (ulong)bVar1;
    puVar8 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar6 = (ulong)(bVar1 & 0x7f);
      lVar4 = 7;
      do {
        if ((puVar7 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_0024f847_caseD_3;
        uVar3 = *puVar8;
        puVar8 = (ulong *)((long)puVar8 + 1);
        uVar6 = uVar6 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
        lVar4 = lVar4 + 7;
      } while ((char)(byte)uVar3 < '\0');
    }
    uVar3 = uVar6 >> 3;
    if (((uint)uVar3 == 0) || (puVar7 <= puVar8)) goto switchD_0024f847_caseD_3;
    switch((uint)uVar6 & 7) {
    case 0:
      uVar5 = 0;
      uVar9 = 0;
      while( true ) {
        puVar10 = (ulong *)((long)puVar8 + 1);
        uVar5 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar9 & 0x3f) | uVar5;
        if (-1 < (char)(byte)*puVar8) break;
        if ((puVar7 <= puVar10) ||
           (bVar2 = 0x38 < uVar9, uVar9 = uVar9 + 7, puVar8 = puVar10, bVar2))
        goto switchD_0024f847_caseD_3;
      }
      local_40.int_value_ = uVar5 & 0xffffffff00000000;
      break;
    case 1:
      puVar10 = puVar8 + 1;
      if (puVar7 < puVar10) goto switchD_0024f847_caseD_3;
      uVar5 = *puVar8;
      local_40.int_value_ = uVar5 & 0xffffffff00000000;
      break;
    case 2:
      puVar8 = (ulong *)((long)puVar8 + 1);
      uVar9 = 0;
      uVar5 = 0;
      puVar10 = puVar8;
      while (uVar9 = (ulong)(*(byte *)((long)puVar10 + -1) & 0x7f) << ((byte)uVar5 & 0x3f) | uVar9,
            (char)*(byte *)((long)puVar10 + -1) < '\0') {
        if (puVar7 <= puVar10) goto switchD_0024f847_caseD_3;
        puVar10 = (ulong *)((long)puVar10 + 1);
        puVar8 = (ulong *)((long)puVar8 + 1);
        bVar2 = 0x38 < uVar5;
        uVar5 = uVar5 + 7;
        if (bVar2) goto switchD_0024f847_caseD_3;
      }
      if (uVar9 <= (ulong)((long)puVar7 - (long)puVar8)) {
        local_40.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
        puVar10 = (ulong *)((long)puVar10 + uVar9);
        uVar5 = (ulong)puVar8 & 0xffffffff;
        goto LAB_0024f923;
      }
    default:
      goto switchD_0024f847_caseD_3;
    case 5:
      puVar10 = (ulong *)((long)puVar8 + 4);
      if (puVar7 < puVar10) goto switchD_0024f847_caseD_3;
      uVar5 = (ulong)(uint)*puVar8;
      local_40.int_value_ = 0;
    }
    uVar9 = 0;
LAB_0024f923:
    raw = puVar10;
  } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar9));
  local_40.int_value_ = local_40.int_value_ | uVar5 & 0xffffffff;
  uVar5 = uVar3 << 0x20 | uVar9;
  local_40.type_ = (byte)(uVar5 >> 0x30) | (byte)uVar6 & 7;
  local_40.size_ = (uint32_t)uVar9;
  local_40.id_ = (uint16_t)(uVar5 >> 0x20);
  if ((short)uVar3 != 0) {
    do {
      if ((ushort)uVar3 < 3) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar3 & 0x3f);
      }
      raw = puVar10;
      if ((ushort)uVar3 == 2) {
        this->last_slice_for_packet_ = local_40.int_value_ != 0;
      }
      else if (((uint)uVar3 & 0xffff) == 1) {
        protozero::Field::get(&local_40,&this->data_);
      }
      else {
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_40,&this->unknown_fields_);
      }
      do {
        if (puVar7 <= raw) goto switchD_0024f847_caseD_3;
        bVar1 = (byte)*raw;
        uVar6 = (ulong)(uint)bVar1;
        puVar8 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar6 = (ulong)(bVar1 & 0x7f);
          lVar4 = 7;
          do {
            if ((puVar7 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_0024f847_caseD_3;
            uVar3 = *puVar8;
            puVar8 = (ulong *)((long)puVar8 + 1);
            uVar6 = uVar6 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
            lVar4 = lVar4 + 7;
          } while ((char)(byte)uVar3 < '\0');
        }
        uVar3 = uVar6 >> 3;
        if (((uint)uVar3 == 0) || (puVar7 <= puVar8)) goto switchD_0024f847_caseD_3;
        switch((uint)uVar6 & 7) {
        case 0:
          uVar5 = 0;
          uVar9 = 0;
          while( true ) {
            puVar10 = (ulong *)((long)puVar8 + 1);
            uVar5 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar9 & 0x3f) | uVar5;
            if (-1 < (char)(byte)*puVar8) break;
            if ((puVar7 <= puVar10) ||
               (bVar2 = 0x38 < uVar9, uVar9 = uVar9 + 7, puVar8 = puVar10, bVar2))
            goto switchD_0024f847_caseD_3;
          }
          local_40.int_value_ = uVar5 & 0xffffffff00000000;
          break;
        case 1:
          puVar10 = puVar8 + 1;
          if (puVar7 < puVar10) goto switchD_0024f847_caseD_3;
          uVar5 = *puVar8;
          local_40.int_value_ = uVar5 & 0xffffffff00000000;
          break;
        case 2:
          puVar8 = (ulong *)((long)puVar8 + 1);
          uVar9 = 0;
          uVar5 = 0;
          puVar10 = puVar8;
          while (uVar9 = (ulong)(*(byte *)((long)puVar10 + -1) & 0x7f) << ((byte)uVar5 & 0x3f) |
                         uVar9, (char)*(byte *)((long)puVar10 + -1) < '\0') {
            if (puVar7 <= puVar10) goto switchD_0024f847_caseD_3;
            puVar10 = (ulong *)((long)puVar10 + 1);
            puVar8 = (ulong *)((long)puVar8 + 1);
            bVar2 = 0x38 < uVar5;
            uVar5 = uVar5 + 7;
            if (bVar2) goto switchD_0024f847_caseD_3;
          }
          if (uVar9 <= (ulong)((long)puVar7 - (long)puVar8)) {
            local_40.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
            puVar10 = (ulong *)((long)puVar10 + uVar9);
            uVar5 = (ulong)puVar8 & 0xffffffff;
            goto LAB_0024fbba;
          }
        default:
          goto switchD_0024f847_caseD_3;
        case 5:
          puVar10 = (ulong *)((long)puVar8 + 4);
          if (puVar7 < puVar10) goto switchD_0024f847_caseD_3;
          uVar5 = (ulong)(uint)*puVar8;
          local_40.int_value_ = 0;
        }
        uVar9 = 0;
LAB_0024fbba:
        raw = puVar10;
      } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar9));
      local_40.int_value_ = local_40.int_value_ | uVar5 & 0xffffffff;
      uVar5 = uVar3 << 0x20 | uVar9;
      local_40.type_ = (byte)(uVar5 >> 0x30) | (byte)uVar6 & 7;
      local_40.size_ = (uint32_t)uVar9;
      local_40.id_ = (uint16_t)(uVar5 >> 0x20);
    } while ((short)uVar3 != 0);
  }
switchD_0024f847_caseD_3:
  return puVar7 == (ulong *)raw;
}

Assistant:

bool ReadBuffersResponse_Slice::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* data */:
        field.get(&data_);
        break;
      case 2 /* last_slice_for_packet */:
        field.get(&last_slice_for_packet_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}